

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_e2e2::PacketQueue<14680064UL>::sendTo
          (PacketQueue<14680064UL> *this,AVCodecContext *codecctx)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  _Elt_pointer pAVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_38;
  
  local_38._M_owns = false;
  local_38._M_device = &this->mMutex;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  pAVar4 = (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == pAVar4) {
    do {
      if (this->mFinished != false) goto LAB_0010a1a3;
      std::condition_variable::wait((unique_lock *)&this->mCondVar);
      pAVar4 = (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    } while ((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur == pAVar4);
  }
  if (pAVar4 == (_Elt_pointer)0x0) {
LAB_0010a1a3:
    iVar2 = avcodec_send_packet(codecctx,0);
  }
  else {
    iVar1 = avcodec_send_packet(codecctx);
    iVar2 = -0xb;
    if (iVar1 != -0xb) {
      if (iVar1 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to send packet: ",0x17);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
      }
      this->mTotalSize =
           this->mTotalSize -
           (ulong)(uint)((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur)->size;
      av_packet_unref();
      std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_front(&this->mPackets);
      iVar2 = iVar1;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return iVar2;
}

Assistant:

int sendTo(AVCodecContext *codecctx)
    {
        std::unique_lock<std::mutex> lock{mMutex};

        AVPacket *pkt{getPacket(lock)};
        if(!pkt) return avcodec_send_packet(codecctx, nullptr);

        const int ret{avcodec_send_packet(codecctx, pkt)};
        if(ret != AVERROR(EAGAIN))
        {
            if(ret < 0)
                std::cerr<< "Failed to send packet: "<<ret <<std::endl;
            pop();
        }
        return ret;
    }